

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
Units_customUnitsScalingFactorIncludingDimensionless_Test::
~Units_customUnitsScalingFactorIncludingDimensionless_Test
          (Units_customUnitsScalingFactorIncludingDimensionless_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, customUnitsScalingFactorIncludingDimensionless)
{
    auto m = libcellml::Model::create("model");
    auto u1 = libcellml::Units::create("u1");

    m->addUnits(u1);

    auto u2 = libcellml::Units::create("u2");
    u2->addUnit("u1");
    u2->addUnit("dimensionless");
    u2->addUnit("radian");
    u2->addUnit("steradian");
    u2->addUnit("metre", 1.0);
    u2->addUnit("metre", -1.0);

    m->addUnits(u2);

    m->linkUnits();

    EXPECT_TRUE(libcellml::Units::compatible(u1, u2));
    EXPECT_EQ(1.0, libcellml::Units::scalingFactor(u1, u2));
    EXPECT_TRUE(libcellml::Units::equivalent(u1, u2));
}